

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocusPerpIntercept.cpp
# Opt level: O3

int GeoCalcs::LocusPerpIntercept
              (Locus *loc,LLPoint *pt2,double *crsFromPt,double *distFromPt,LLPoint *intPt,
              double dTol)

{
  double dVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  LLPoint LVar5;
  double newDist;
  InverseResult result;
  LLPoint geoPt;
  double local_e0;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  double dStack_c0;
  double *local_b0;
  double *local_a8;
  double local_a0;
  InverseResult local_98;
  double local_78;
  double dStack_70;
  LLPoint local_68;
  LLPoint *local_58;
  double local_50;
  double local_48;
  LLPoint local_40;
  
  local_98.azimuth = 0.0;
  local_98.reverseAzimuth = 0.0;
  local_98.distance = 0.0;
  DistVincenty(&loc->geoStart,&loc->geoEnd,&local_98);
  if (dTol <= ABS(loc->startDist - loc->endDist)) {
    local_d8 = local_98.distance;
    local_a0 = local_98.azimuth;
    local_58 = intPt;
    DistVincenty(&loc->locusStart,&loc->locusEnd,&local_98);
    LVar5 = PerpIntercept(&loc->locusStart,local_98.azimuth,pt2,crsFromPt,distFromPt,dTol);
    local_68.longitude = LVar5.longitude;
    local_68.latitude = LVar5.latitude;
    local_b0 = distFromPt;
    local_a8 = crsFromPt;
    LVar5 = PerpIntercept(&loc->geoStart,local_a0,&local_68,crsFromPt,distFromPt,dTol);
    local_40.longitude = LVar5.longitude;
    local_40.latitude = LVar5.latitude;
    local_50 = atan((loc->startDist - loc->endDist) / local_d8);
    local_78 = 0.0;
    dStack_70 = 0.0;
    local_c8 = 0.0;
    dStack_c0 = 0.0;
    DistVincenty(&loc->geoStart,&local_40,&local_98);
    local_e0 = 0.0;
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    dStack_c0 = local_98.distance;
    while( true ) {
      if ((uVar2 != 0) &&
         (((NAN(local_e0) || (0xe < uVar2)) || (ABS((double)CONCAT44(uVar4,uVar3)) <= dTol))))
      goto LAB_00158d8c;
      LVar5 = DestVincenty(&loc->geoStart,local_a0,dStack_c0);
      local_40.longitude = LVar5.longitude;
      local_40.latitude = LVar5.latitude;
      LVar5 = PointOnLocusP(loc,&local_40,dTol,5e-16);
      local_68.longitude = LVar5.longitude;
      local_68.latitude = LVar5.latitude;
      DistVincenty(&local_68,pt2,&local_98);
      local_d8 = -local_98.distance;
      uStack_d0 = 0x8000000000000000;
      dVar1 = LocusCrsAtPoint(loc,&local_68,&local_40,1e-08);
      dVar1 = SignAzimuthDifference(dVar1,local_98.azimuth);
      dStack_70 = cos(dVar1);
      dStack_70 = dStack_70 * local_d8;
      if (ABS(dStack_70) < dTol) break;
      if (uVar2 == 0) {
        local_48 = dStack_c0;
        local_d8 = dStack_70;
        uStack_d0 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
        dVar1 = cos(local_50);
        local_e0 = local_d8 * dVar1 + local_48;
      }
      else {
        FindLinearRoot(&local_c8,&local_78,&local_e0);
      }
      local_c8 = dStack_c0;
      local_78 = dStack_70;
      uVar3 = SUB84(dStack_70,0);
      uVar4 = (undefined4)((ulong)dStack_70 >> 0x20);
      uVar2 = uVar2 + 1;
      dStack_c0 = local_e0;
    }
    *local_b0 = local_98.distance;
    *local_a8 = local_98.reverseAzimuth;
LAB_00158d8c:
    local_58->latitude = local_68.latitude;
    local_58->longitude = local_68.longitude;
    DistVincenty(pt2,local_58,&local_98);
    *local_b0 = local_98.distance;
    *local_a8 = local_98.azimuth;
  }
  else {
    LVar5 = PerpIntercept(&loc->geoStart,local_98.azimuth,pt2,crsFromPt,distFromPt,dTol);
    local_68.longitude = LVar5.longitude;
    local_68.latitude = LVar5.latitude;
    LVar5 = PointOnLocusP(loc,&local_68,dTol,5e-16);
    intPt->latitude = LVar5.latitude;
    intPt->longitude = LVar5.longitude;
    DistVincenty(pt2,intPt,&local_98);
    *distFromPt = local_98.distance;
    *crsFromPt = local_98.azimuth;
  }
  return 1;
}

Assistant:

int LocusPerpIntercept(const Locus &loc, const LLPoint &pt2, double &crsFromPt,
                           double &distFromPt, LLPoint &intPt, double dTol)
    {
        InverseResult result;
        DistVincenty(loc.geoStart, loc.geoEnd, result);
        double gcrs = result.azimuth;
        double gdist = result.distance;

        if (fabs(loc.startDist - loc.endDist) < dTol)
        {
            const LLPoint geoPt = PerpIntercept(loc.geoStart, gcrs, pt2, crsFromPt, distFromPt, dTol);
            intPt = PointOnLocusP(loc, geoPt, dTol, kEps);
            DistVincenty(pt2, intPt, result);
            distFromPt = result.distance;
            crsFromPt = result.azimuth;
            return 1;
        }

        DistVincenty(loc.locusStart, loc.locusEnd, result);
        LLPoint locPt = PerpIntercept(loc.locusStart, result.azimuth, pt2, crsFromPt, distFromPt, dTol);
        LLPoint geoPt = PerpIntercept(loc.geoStart, gcrs, locPt, crsFromPt, distFromPt, dTol);
        const double locAngle = atan((loc.startDist - loc.endDist) / gdist);

        double distarray[2], errarray[2];
        distarray[0] = distarray[1] = errarray[0] = errarray[1] = 0.0;

        DistVincenty(loc.geoStart, geoPt, result);
        distarray[1] = result.distance;

        const int maxCount = 15;
        double newDist = 0.0;
        int k = 0;
        while (k == 0 || (!std::isnan(newDist) && fabs(errarray[1]) > dTol && k < maxCount))
        {
            geoPt = DestVincenty(loc.geoStart, gcrs, distarray[1]);
            locPt = PointOnLocusP(loc /*loc.geoStart*/, geoPt, dTol, kEps);

            DistVincenty(locPt, pt2, result);
            errarray[1] = -result.distance * cos(fabs(
                    SignAzimuthDifference(LocusCrsAtPoint(loc, locPt, geoPt, 1e-8), result.azimuth)));

            if (fabs(errarray[1]) < dTol)
            {
                distFromPt = result.distance;
                crsFromPt = result.reverseAzimuth;
                intPt = locPt;
                break;
            }

            if (k == 0)
                newDist = distarray[1] + errarray[1] * cos(locAngle);
            else
                FindLinearRoot(distarray, errarray, newDist);
            distarray[0] = distarray[1];
            distarray[1] = newDist;
            errarray[0] = errarray[1];
            k++;
        }

        intPt = locPt;
        DistVincenty(pt2, intPt, result);
        distFromPt = result.distance;
        crsFromPt = result.azimuth;
        return 1;
    }